

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioApi.c
# Opt level: O2

char * Mio_GateReadPinName(Mio_Gate_t *pGate,int iPin)

{
  Mio_Pin_t *pMVar1;
  Mio_Pin_t **ppMVar2;
  bool bVar3;
  
  ppMVar2 = &pGate->pPins;
  while( true ) {
    pMVar1 = *ppMVar2;
    if (pMVar1 == (Mio_Pin_t *)0x0) {
      return (char *)0x0;
    }
    bVar3 = iPin == 0;
    iPin = iPin + -1;
    if (bVar3) break;
    ppMVar2 = &pMVar1->pNext;
  }
  return pMVar1->pName;
}

Assistant:

char * Mio_GateReadPinName( Mio_Gate_t * pGate, int iPin )
{
    Mio_Pin_t * pPin;
    int i = 0;
    Mio_GateForEachPin( pGate, pPin )
        if ( i++ == iPin )
            return Mio_PinReadName(pPin);
    return NULL;
}